

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msvc_vcproj.cpp
# Opt level: O0

void __thiscall VcprojGenerator::initExtraCompilerOutputs(VcprojGenerator *this)

{
  bool bVar1;
  const_iterator o;
  VcprojGenerator *this_00;
  QList<ProString> *pQVar2;
  qsizetype qVar3;
  long in_RDI;
  long in_FS_OFFSET;
  QString *filename_1;
  int i_1;
  ProStringList *tmp_in_1;
  ProString *inputVar;
  ProStringList *__range3;
  QString *filename;
  int i;
  ProStringList *tmp_in;
  ProString *outputVar;
  bool addOnInput;
  ProStringList *outputs;
  ProStringList *__range2;
  ProStringList *inputVars;
  ProStringList *quc;
  const_iterator __end3;
  const_iterator __begin3;
  QString tmp_out;
  VCFilter extraCompile;
  ProString var;
  const_iterator __end2;
  const_iterator __begin2;
  ProStringList inputFiles;
  ConstIterator it;
  ProStringList otherFilters;
  parameter_type in_stack_fffffffffffff348;
  VCFilter *in_stack_fffffffffffff350;
  VCFilter *filename_00;
  VCFilter *in_stack_fffffffffffff358;
  ProString *in_stack_fffffffffffff360;
  ProString *pPVar4;
  QMakeEvaluator *in_stack_fffffffffffff368;
  QStringList *in_stack_fffffffffffff370;
  QStringList *in_stack_fffffffffffff378;
  ProString *in_stack_fffffffffffff380;
  VcprojGenerator *in_stack_fffffffffffff388;
  VcprojGenerator *this_01;
  int local_bcc;
  int local_ba4;
  undefined1 local_ad8 [192];
  QStringBuilder<QString_&,_const_QString_&> local_a18;
  QStringBuilder<const_ProString_&,_const_char_(&)[8]> local_9c0;
  qsizetype local_968;
  Data *local_960;
  char16_t *local_958;
  QStringBuilder<const_ProString_&,_const_char_(&)[14]> local_950;
  ProString local_910 [7];
  undefined1 local_7c0 [72];
  triState local_778;
  long local_768;
  QStringBuilder<const_ProString_&,_const_char_(&)[8]> local_378;
  undefined1 local_338 [48];
  ProString *local_308;
  const_iterator local_300;
  const_iterator local_2f8;
  undefined8 local_2f0;
  undefined8 local_2e8;
  undefined8 local_2e0;
  QStringBuilder<const_ProString_&,_const_char_(&)[7]> local_2d8;
  const_iterator local_298 [79];
  undefined8 local_20;
  undefined8 local_18;
  undefined8 local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_20 = 0xaaaaaaaaaaaaaaaa;
  local_18 = 0xaaaaaaaaaaaaaaaa;
  local_10 = 0xaaaaaaaaaaaaaaaa;
  ProStringList::ProStringList((ProStringList *)0x29367e);
  ProString::ProString((ProString *)in_stack_fffffffffffff350,(char *)in_stack_fffffffffffff368);
  ProStringList::operator<<
            ((ProStringList *)in_stack_fffffffffffff350,(ProString *)in_stack_fffffffffffff348);
  ProString::ProString((ProString *)in_stack_fffffffffffff350,(char *)in_stack_fffffffffffff368);
  ProStringList::operator<<
            ((ProStringList *)in_stack_fffffffffffff350,(ProString *)in_stack_fffffffffffff348);
  ProString::ProString((ProString *)in_stack_fffffffffffff350,(char *)in_stack_fffffffffffff368);
  ProStringList::operator<<
            ((ProStringList *)in_stack_fffffffffffff350,(ProString *)in_stack_fffffffffffff348);
  ProString::ProString((ProString *)in_stack_fffffffffffff350,(char *)in_stack_fffffffffffff368);
  ProStringList::operator<<
            ((ProStringList *)in_stack_fffffffffffff350,(ProString *)in_stack_fffffffffffff348);
  ProString::ProString((ProString *)in_stack_fffffffffffff350,(char *)in_stack_fffffffffffff368);
  ProStringList::operator<<
            ((ProStringList *)in_stack_fffffffffffff350,(ProString *)in_stack_fffffffffffff348);
  ProString::ProString((ProString *)in_stack_fffffffffffff350,(char *)in_stack_fffffffffffff368);
  ProStringList::operator<<
            ((ProStringList *)in_stack_fffffffffffff350,(ProString *)in_stack_fffffffffffff348);
  ProString::ProString((ProString *)in_stack_fffffffffffff350,(char *)in_stack_fffffffffffff368);
  ProStringList::operator<<
            ((ProStringList *)in_stack_fffffffffffff350,(ProString *)in_stack_fffffffffffff348);
  ProString::ProString((ProString *)in_stack_fffffffffffff350,(char *)in_stack_fffffffffffff368);
  ProStringList::operator<<
            ((ProStringList *)in_stack_fffffffffffff350,(ProString *)in_stack_fffffffffffff348);
  ProString::ProString((ProString *)in_stack_fffffffffffff350,(char *)in_stack_fffffffffffff368);
  ProStringList::operator<<
            ((ProStringList *)in_stack_fffffffffffff350,(ProString *)in_stack_fffffffffffff348);
  ProString::ProString((ProString *)in_stack_fffffffffffff350,(char *)in_stack_fffffffffffff368);
  ProStringList::operator<<
            ((ProStringList *)in_stack_fffffffffffff350,(ProString *)in_stack_fffffffffffff348);
  ProString::ProString((ProString *)in_stack_fffffffffffff350,(char *)in_stack_fffffffffffff368);
  ProStringList::operator<<
            ((ProStringList *)in_stack_fffffffffffff350,(ProString *)in_stack_fffffffffffff348);
  ProString::ProString((ProString *)in_stack_fffffffffffff350,(char *)in_stack_fffffffffffff368);
  ProStringList::operator<<
            ((ProStringList *)in_stack_fffffffffffff350,(ProString *)in_stack_fffffffffffff348);
  ProString::~ProString((ProString *)0x2938c3);
  ProString::~ProString((ProString *)0x2938d0);
  ProString::~ProString((ProString *)0x2938dd);
  ProString::~ProString((ProString *)0x2938ea);
  ProString::~ProString((ProString *)0x2938f7);
  ProString::~ProString((ProString *)0x293904);
  ProString::~ProString((ProString *)0x293911);
  ProString::~ProString((ProString *)0x29391e);
  ProString::~ProString((ProString *)0x29392b);
  ProString::~ProString((ProString *)0x293938);
  ProString::~ProString((ProString *)0x293945);
  ProString::~ProString((ProString *)0x293952);
  ProKey::ProKey((ProKey *)in_stack_fffffffffffff350,(char *)in_stack_fffffffffffff348);
  QMakeProject::values
            ((QMakeProject *)in_stack_fffffffffffff350,(ProKey *)in_stack_fffffffffffff348);
  ProKey::~ProKey((ProKey *)0x2939b9);
  local_298[0].i = (ProString *)0xaaaaaaaaaaaaaaaa;
  local_298[0] = QList<ProString>::begin((QList<ProString> *)in_stack_fffffffffffff350);
  do {
    o = QList<ProString>::end((QList<ProString> *)in_stack_fffffffffffff350);
    bVar1 = QList<ProString>::const_iterator::operator!=(local_298,o);
    if (!bVar1) {
      ProStringList::~ProStringList((ProStringList *)0x29478d);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
        return;
      }
      __stack_chk_fail();
    }
    QList<ProString>::const_iterator::operator*(local_298);
    local_2d8 = ::operator+((ProString *)in_stack_fffffffffffff350,
                            (char (*) [7])in_stack_fffffffffffff348);
    ProKey::ProKey<ProString_const&,char_const(&)[7]>
              ((ProKey *)in_stack_fffffffffffff350,
               (QStringBuilder<const_ProString_&,_const_char_(&)[7]> *)in_stack_fffffffffffff348);
    QMakeProject::values
              ((QMakeProject *)in_stack_fffffffffffff350,(ProKey *)in_stack_fffffffffffff348);
    ProKey::~ProKey((ProKey *)0x293aab);
    local_2f0 = 0xaaaaaaaaaaaaaaaa;
    local_2e8 = 0xaaaaaaaaaaaaaaaa;
    local_2e0 = 0xaaaaaaaaaaaaaaaa;
    ProStringList::ProStringList((ProStringList *)0x293af2);
    local_2f8.i = (ProString *)0xaaaaaaaaaaaaaaaa;
    local_2f8 = QList<ProString>::begin((QList<ProString> *)in_stack_fffffffffffff350);
    local_300.i = (ProString *)0xaaaaaaaaaaaaaaaa;
    local_300 = QList<ProString>::end((QList<ProString> *)in_stack_fffffffffffff350);
    while( true ) {
      local_308 = local_300.i;
      bVar1 = QList<ProString>::const_iterator::operator!=(&local_2f8,local_300);
      if (!bVar1) break;
      memset(local_338,0xaa,0x30);
      QList<ProString>::const_iterator::operator*(&local_2f8);
      ProString::ProString
                ((ProString *)in_stack_fffffffffffff350,(ProString *)in_stack_fffffffffffff348);
      QMakeProject::values
                ((QMakeProject *)in_stack_fffffffffffff350,(ProKey *)in_stack_fffffffffffff348);
      QList<ProString>::append
                ((QList<ProString> *)in_stack_fffffffffffff360,
                 (QList<ProString> *)in_stack_fffffffffffff358);
      ProString::~ProString((ProString *)0x293c07);
      QList<ProString>::const_iterator::operator++(&local_2f8);
    }
    this_01 = *(VcprojGenerator **)(in_RDI + 0xd8);
    QList<ProString>::const_iterator::operator*(local_298);
    local_378 = ::operator+((ProString *)in_stack_fffffffffffff350,
                            (char (*) [8])in_stack_fffffffffffff348);
    ProKey::ProKey<ProString_const&,char_const(&)[8]>
              ((ProKey *)in_stack_fffffffffffff350,
               (QStringBuilder<const_ProString_&,_const_char_(&)[8]> *)in_stack_fffffffffffff348);
    this_00 = (VcprojGenerator *)
              QMakeProject::values
                        ((QMakeProject *)in_stack_fffffffffffff350,
                         (ProKey *)in_stack_fffffffffffff348);
    ProKey::~ProKey((ProKey *)0x293ca4);
    memset(local_7c0,0xaa,0x448);
    VCFilter::VCFilter(in_stack_fffffffffffff350);
    QList<ProString>::const_iterator::operator->(local_298);
    ProString::toQString((ProString *)in_stack_fffffffffffff348);
    ProString::ProString((ProString *)in_stack_fffffffffffff350,&in_stack_fffffffffffff348->Name);
    ProStringList::toQStringList((ProStringList *)in_stack_fffffffffffff370);
    ProStringList::toQStringList((ProStringList *)in_stack_fffffffffffff370);
    extraCompilerName(in_stack_fffffffffffff388,in_stack_fffffffffffff380,in_stack_fffffffffffff378,
                      in_stack_fffffffffffff370);
    QString::operator=(&in_stack_fffffffffffff350->Name,&in_stack_fffffffffffff348->Name);
    QString::~QString((QString *)0x293d80);
    QList<QString>::~QList((QList<QString> *)0x293d8d);
    QList<QString>::~QList((QList<QString> *)0x293d9a);
    ProString::~ProString((ProString *)0x293da7);
    QString::~QString((QString *)0x293db4);
    local_778 = _False;
    QString::operator=(&in_stack_fffffffffffff358->Name,(char *)in_stack_fffffffffffff378);
    QString::QString(&in_stack_fffffffffffff358->Name,(char *)in_stack_fffffffffffff388);
    ::operator+(&in_stack_fffffffffffff358->Name,(char (*) [2])in_stack_fffffffffffff350);
    QList<ProString>::const_iterator::operator*(local_298);
    ::operator+((QStringBuilder<QString,_const_char_(&)[2]> *)in_stack_fffffffffffff358,
                (ProString *)in_stack_fffffffffffff350);
    ::QStringBuilder::operator_cast_to_QString
              ((QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_ProString_&> *)
               in_stack_fffffffffffff348);
    QString::operator=(&in_stack_fffffffffffff350->Name,&in_stack_fffffffffffff348->Name);
    QString::~QString((QString *)0x293e67);
    QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_ProString_&>::~QStringBuilder
              ((QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_ProString_&> *)
               0x293e74);
    QStringBuilder<QString,_const_char_(&)[2]>::~QStringBuilder
              ((QStringBuilder<QString,_const_char_(&)[2]> *)0x293e81);
    QString::~QString((QString *)0x293e8e);
    QList<ProString>::const_iterator::operator*(local_298);
    firstExpandedOutputFileName(this_00,(ProString *)this_01);
    bVar1 = hasBuiltinCompiler((QString *)this_01);
    QString::~QString((QString *)0x293ed1);
    if (bVar1) {
      local_ad8._40_8_ = -0x5555555555555556;
      local_ad8._40_8_ = QList<ProString>::begin((QList<ProString> *)in_stack_fffffffffffff350);
      local_ad8._32_8_ = (char16_t *)0xaaaaaaaaaaaaaaaa;
      local_ad8._32_8_ = QList<ProString>::end((QList<ProString> *)in_stack_fffffffffffff350);
      while( true ) {
        local_ad8._24_8_ = local_ad8._32_8_;
        bVar1 = QList<ProString>::const_iterator::operator!=
                          ((const_iterator *)(local_ad8 + 0x28),(const_iterator)local_ad8._32_8_);
        if (!bVar1) break;
        QList<ProString>::const_iterator::operator*((const_iterator *)(local_ad8 + 0x28));
        bVar1 = ProStringList::contains
                          ((ProStringList *)in_stack_fffffffffffff368,in_stack_fffffffffffff360,
                           (CaseSensitivity)((ulong)in_stack_fffffffffffff358 >> 0x20));
        if (!bVar1) {
          pQVar2 = &QMakeProject::values
                              ((QMakeProject *)in_stack_fffffffffffff350,
                               (ProKey *)in_stack_fffffffffffff348)->super_QList<ProString>;
          local_bcc = 0;
          while( true ) {
            in_stack_fffffffffffff358 = (VCFilter *)(long)local_bcc;
            qVar3 = QList<ProString>::size(pQVar2);
            if (qVar3 <= (long)in_stack_fffffffffffff358) break;
            QList<ProString>::at
                      ((QList<ProString> *)in_stack_fffffffffffff350,
                       (qsizetype)in_stack_fffffffffffff348);
            ProString::toQString((ProString *)in_stack_fffffffffffff348);
            filename_00 = (VCFilter *)local_ad8;
            bVar1 = QHash<QString,_QList<QString>_>::contains
                              ((QHash<QString,_QList<QString>_> *)in_stack_fffffffffffff358,
                               &in_stack_fffffffffffff350->Name);
            if ((bVar1) &&
               (bVar1 = otherFiltersContain(this_01,(QString *)in_stack_fffffffffffff388), !bVar1))
            {
              QString::QString((QString *)0x29461c);
              QString::QString((QString *)0x294629);
              MakefileGenerator::replaceExtraCompilerVariables
                        ((MakefileGenerator *)this_01,(QString *)in_stack_fffffffffffff388,
                         &in_stack_fffffffffffff380->m_string,(QString *)in_stack_fffffffffffff378,
                         (ReplaceFor)((ulong)in_stack_fffffffffffff370 >> 0x20));
              Option::fixPathToTargetOS
                        ((QString *)in_stack_fffffffffffff368,
                         SUB81((ulong)in_stack_fffffffffffff360 >> 0x38,0),
                         SUB81((ulong)in_stack_fffffffffffff360 >> 0x30,0));
              VCFilter::addFile(in_stack_fffffffffffff358,&filename_00->Name);
              QString::~QString((QString *)0x294694);
              QString::~QString((QString *)0x2946a1);
              QString::~QString((QString *)0x2946ae);
              QString::~QString((QString *)0x2946bb);
              in_stack_fffffffffffff350 = filename_00;
            }
            QString::~QString((QString *)0x2946c8);
            local_bcc = local_bcc + 1;
          }
        }
        QList<ProString>::const_iterator::operator++((const_iterator *)(local_ad8 + 0x28));
      }
LAB_002946f6:
      local_768 = in_RDI + 0x268;
      QList<VCFilter>::append
                ((QList<VCFilter> *)in_stack_fffffffffffff350,in_stack_fffffffffffff348);
    }
    else {
      in_stack_fffffffffffff388 = *(VcprojGenerator **)(in_RDI + 0xd8);
      QList<ProString>::const_iterator::operator*(local_298);
      local_950 = ::operator+((ProString *)in_stack_fffffffffffff350,
                              (char (*) [14])in_stack_fffffffffffff348);
      ProKey::ProKey<ProString_const&,char_const(&)[14]>
                ((ProKey *)in_stack_fffffffffffff350,
                 (QStringBuilder<const_ProString_&,_const_char_(&)[14]> *)in_stack_fffffffffffff348)
      ;
      QMakeEvaluator::first(in_stack_fffffffffffff368,(ProKey *)in_stack_fffffffffffff360);
      ProKey::~ProKey((ProKey *)0x293f7a);
      bVar1 = ProString::isEmpty(local_910);
      if ((bVar1) ||
         (bVar1 = ProStringList::contains
                            ((ProStringList *)in_stack_fffffffffffff368,in_stack_fffffffffffff360,
                             (CaseSensitivity)((ulong)in_stack_fffffffffffff358 >> 0x20)), !bVar1))
      {
        local_968 = -0x5555555555555556;
        local_960 = (Data *)0xaaaaaaaaaaaaaaaa;
        local_958 = (char16_t *)0xaaaaaaaaaaaaaaaa;
        QString::QString((QString *)0x294005);
        bVar1 = QList<ProString>::isEmpty((QList<ProString> *)0x294012);
        if (!bVar1) {
          QList<ProString>::first((QList<ProString> *)in_stack_fffffffffffff350);
          ProString::toQString((ProString *)in_stack_fffffffffffff348);
          QString::operator=(&in_stack_fffffffffffff350->Name,&in_stack_fffffffffffff348->Name);
          QString::~QString((QString *)0x294055);
        }
        in_stack_fffffffffffff378 = *(QStringList **)(in_RDI + 0xd8);
        QList<ProString>::const_iterator::operator*(local_298);
        local_9c0 = ::operator+((ProString *)in_stack_fffffffffffff350,
                                (char (*) [8])in_stack_fffffffffffff348);
        ProKey::ProKey<ProString_const&,char_const(&)[8]>
                  ((ProKey *)in_stack_fffffffffffff350,
                   (QStringBuilder<const_ProString_&,_const_char_(&)[8]> *)in_stack_fffffffffffff348
                  );
        QMakeProject::values
                  ((QMakeProject *)in_stack_fffffffffffff350,(ProKey *)in_stack_fffffffffffff348);
        in_stack_fffffffffffff380 =
             (ProString *)
             QListSpecialMethodsBase<ProString>::indexOf<char[8]>
                       ((QListSpecialMethodsBase<ProString> *)in_stack_fffffffffffff350,
                        (char (*) [8])in_stack_fffffffffffff348,0x2940cf);
        ProKey::~ProKey((ProKey *)0x2940e1);
        if (in_stack_fffffffffffff380 == (ProString *)0xffffffffffffffff) {
          bVar1 = QList<ProString>::isEmpty((QList<ProString> *)0x2941ff);
          if (!bVar1) {
            in_stack_fffffffffffff370 = *(QStringList **)(in_RDI + 0xd8);
            QList<ProString>::first((QList<ProString> *)in_stack_fffffffffffff350);
            pQVar2 = &QMakeProject::values
                                ((QMakeProject *)in_stack_fffffffffffff350,
                                 (ProKey *)in_stack_fffffffffffff348)->super_QList<ProString>;
            local_ba4 = 0;
            while( true ) {
              in_stack_fffffffffffff368 = (QMakeEvaluator *)(long)local_ba4;
              qVar3 = QList<ProString>::size(pQVar2);
              if (qVar3 <= (long)in_stack_fffffffffffff368) break;
              QList<ProString>::at
                        ((QList<ProString> *)in_stack_fffffffffffff350,
                         (qsizetype)in_stack_fffffffffffff348);
              ProString::toQString((ProString *)in_stack_fffffffffffff348);
              pPVar4 = (ProString *)(local_ad8 + 0x78);
              bVar1 = QHash<QString,_QList<QString>_>::contains
                                ((QHash<QString,_QList<QString>_> *)in_stack_fffffffffffff358,
                                 &in_stack_fffffffffffff350->Name);
              if ((bVar1) &&
                 (bVar1 = otherFiltersContain(this_01,(QString *)in_stack_fffffffffffff388), !bVar1)
                 ) {
                QString::QString((QString *)0x294335);
                MakefileGenerator::replaceExtraCompilerVariables
                          ((MakefileGenerator *)this_01,(QString *)in_stack_fffffffffffff388,
                           &in_stack_fffffffffffff380->m_string,(QString *)in_stack_fffffffffffff378
                           ,(ReplaceFor)((ulong)in_stack_fffffffffffff370 >> 0x20));
                Option::fixPathToTargetOS
                          ((QString *)in_stack_fffffffffffff368,SUB81((ulong)pPVar4 >> 0x38,0),
                           SUB81((ulong)pPVar4 >> 0x30,0));
                VCFilter::addFile(in_stack_fffffffffffff358,&in_stack_fffffffffffff350->Name);
                QString::~QString((QString *)0x2943a0);
                QString::~QString((QString *)0x2943ad);
                QString::~QString((QString *)0x2943ba);
                in_stack_fffffffffffff360 = pPVar4;
              }
              QString::~QString((QString *)0x2943c7);
              local_ba4 = local_ba4 + 1;
            }
          }
        }
        else {
          local_a18 = ::operator+(&in_stack_fffffffffffff350->Name,&in_stack_fffffffffffff348->Name)
          ;
          ::QStringBuilder::operator_cast_to_QString
                    ((QStringBuilder<QString_&,_const_QString_&> *)in_stack_fffffffffffff348);
          QString::QString((QString *)0x29413e);
          QString::QString((QString *)0x29414b);
          MakefileGenerator::replaceExtraCompilerVariables
                    ((MakefileGenerator *)this_01,(QString *)in_stack_fffffffffffff388,
                     &in_stack_fffffffffffff380->m_string,(QString *)in_stack_fffffffffffff378,
                     (ReplaceFor)((ulong)in_stack_fffffffffffff370 >> 0x20));
          Option::fixPathToTargetOS
                    ((QString *)in_stack_fffffffffffff368,
                     SUB81((ulong)in_stack_fffffffffffff360 >> 0x38,0),
                     SUB81((ulong)in_stack_fffffffffffff360 >> 0x30,0));
          VCFilter::addFile(in_stack_fffffffffffff358,&in_stack_fffffffffffff350->Name);
          QString::~QString((QString *)0x2941b9);
          QString::~QString((QString *)0x2941c6);
          QString::~QString((QString *)0x2941d3);
          QString::~QString((QString *)0x2941e0);
          QString::~QString((QString *)0x2941ed);
        }
        QString::~QString((QString *)0x2943ee);
        bVar1 = false;
      }
      else {
        bVar1 = true;
      }
      ProString::~ProString((ProString *)0x294406);
      if (!bVar1) goto LAB_002946f6;
    }
    VCFilter::~VCFilter(in_stack_fffffffffffff350);
    ProStringList::~ProStringList((ProStringList *)0x29475d);
    QList<ProString>::const_iterator::operator++(local_298);
  } while( true );
}

Assistant:

void VcprojGenerator::initExtraCompilerOutputs()
{
    ProStringList otherFilters;
    otherFilters << "FORMS"
                 << "GENERATED_FILES"
                 << "GENERATED_SOURCES"
                 << "HEADERS"
                 << "IDLSOURCES"
                 << "LEXSOURCES"
                 << "RC_FILE"
                 << "RESOURCES"
                 << "RES_FILE"
                 << "SOURCES"
                 << "TRANSLATIONS"
                 << "YACCSOURCES";
    const ProStringList &quc = project->values("QMAKE_EXTRA_COMPILERS");
    for (ProStringList::ConstIterator it = quc.begin(); it != quc.end(); ++it) {
        const ProStringList &inputVars = project->values(ProKey(*it + ".input"));
        ProStringList inputFiles;
        for (auto var : inputVars)
            inputFiles.append(project->values(var.toKey()));
        const ProStringList &outputs = project->values(ProKey(*it + ".output"));

        // Create an extra compiler filter and add the files
        VCFilter extraCompile;
        extraCompile.Name = extraCompilerName(it->toQString(), inputFiles.toQStringList(),
                                              outputs.toQStringList());
        extraCompile.ParseFiles = _False;
        extraCompile.Filter = "";
        extraCompile.Guid = QString(_GUIDExtraCompilerFiles) + "-" + (*it);

        bool addOnInput = hasBuiltinCompiler(firstExpandedOutputFileName(*it));
        if (!addOnInput) {
            // If the extra compiler has a variable_out set that is already handled
            // some other place, ignore it.
            const ProString &outputVar = project->first(ProKey(*it + ".variable_out"));
            if (!outputVar.isEmpty() && otherFilters.contains(outputVar))
                continue;

            QString tmp_out;
            if (!outputs.isEmpty())
                tmp_out = outputs.first().toQString();
            if (project->values(ProKey(*it + ".CONFIG")).indexOf("combine") != -1) {
                // Combined output, only one file result. Use .cbt file.
                extraCompile.addFile(Option::fixPathToTargetOS(
                        replaceExtraCompilerVariables(tmp_out + customBuildToolFilterFileSuffix,
                                                      QString(), QString(), NoShell), false));
            } else if (!inputVars.isEmpty()) {
                // One output file per input
                const ProStringList &tmp_in = project->values(inputVars.first().toKey());
                for (int i = 0; i < tmp_in.size(); ++i) {
                    const QString &filename = tmp_in.at(i).toQString();
                    if (extraCompilerSources.contains(filename) && !otherFiltersContain(filename))
                        extraCompile.addFile(Option::fixPathToTargetOS(
                                replaceExtraCompilerVariables(filename, tmp_out, QString(), NoShell), false));
                }
            }
        } else {
            // In this case we the outputs have a built-in compiler, so we cannot add the custom
            // build steps there. So, we turn it around and add it to the input files instead,
            // provided that the input file variable is not handled already (those in otherFilters
            // are handled, so we avoid them).
            for (const ProString &inputVar : inputVars) {
                if (!otherFilters.contains(inputVar)) {
                    const ProStringList &tmp_in = project->values(inputVar.toKey());
                    for (int i = 0; i < tmp_in.size(); ++i) {
                        const QString &filename = tmp_in.at(i).toQString();
                        if (extraCompilerSources.contains(filename) && !otherFiltersContain(filename))
                            extraCompile.addFile(Option::fixPathToTargetOS(
                                    replaceExtraCompilerVariables(filename, QString(), QString(), NoShell), false));
                    }
                }
            }
        }
        extraCompile.Project = this;
        extraCompile.Config = &(vcProject.Configuration);

        vcProject.ExtraCompilersFiles.append(extraCompile);
    }
}